

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O1

void __thiscall HModel::initBound(HModel *this,int phase)

{
  double dVar1;
  int iVar2;
  int iVar3;
  pointer pdVar4;
  pointer pdVar5;
  pointer pdVar6;
  pointer pdVar7;
  pointer pdVar8;
  long lVar9;
  
  iVar2 = this->numCol;
  if (0 < (long)iVar2) {
    pdVar4 = (this->colLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (this->colUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = (this->workLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar7 = (this->workUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar8 = (this->workRange).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar9 = 0;
    do {
      pdVar6[lVar9] = pdVar4[lVar9];
      dVar1 = pdVar5[lVar9];
      pdVar7[lVar9] = dVar1;
      pdVar8[lVar9] = dVar1 - pdVar6[lVar9];
      lVar9 = lVar9 + 1;
    } while (iVar2 != lVar9);
  }
  initPh2RowBound(this,0,this->numRow + -1);
  if ((phase != 2) && (iVar2 = this->numTot, 0 < (long)iVar2)) {
    pdVar4 = (this->workLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (this->workUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar3 = this->numCol;
    pdVar6 = (this->workRange).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar9 = 0;
    do {
      dVar1 = pdVar4[lVar9];
      if ((dVar1 != -1e+200) || (NAN(dVar1))) {
LAB_00129adb:
        dVar1 = pdVar5[lVar9];
        pdVar4[lVar9] = 0.0;
        if ((dVar1 != 1e+200) || (NAN(dVar1))) {
LAB_00129af7:
          pdVar5[lVar9] = 0.0;
        }
        else {
          pdVar5[lVar9] = 1.0;
        }
LAB_00129aff:
        pdVar6[lVar9] = pdVar5[lVar9] - pdVar4[lVar9];
      }
      else {
        if ((pdVar5[lVar9] != 1e+200) || (NAN(pdVar5[lVar9]))) {
          if ((dVar1 != -1e+200) || (NAN(dVar1))) goto LAB_00129adb;
          pdVar4[lVar9] = -1.0;
          goto LAB_00129af7;
        }
        if (lVar9 < iVar3) {
          pdVar4[lVar9] = -1000.0;
          pdVar5[lVar9] = 1000.0;
          goto LAB_00129aff;
        }
      }
      lVar9 = lVar9 + 1;
    } while (iVar2 != lVar9);
  }
  return;
}

Assistant:

void HModel::initBound(int phase) {
  // Initialise the Phase 2 bounds (and ranges). NB Phase 2 bounds
  // necessary to compute Phase 1 bounds
  initPh2ColBound(0, numCol-1);
  initPh2RowBound(0, numRow-1);
  if (phase == 2) return;

  // In Phase 1: change to dual phase 1 bound
  const double inf = HSOL_CONST_INF;
  for (int i = 0; i < numTot; i++) {
    if (workLower[i] == -inf && workUpper[i] == inf) {
      // Won't change for row variables: they should never become
      // non basic
      if (i >= numCol) continue;
      workLower[i] = -1000, workUpper[i] = 1000;  // FREE
    } else if (workLower[i] == -inf) {
      workLower[i] = -1, workUpper[i] = 0;        // UPPER
    } else if (workUpper[i] == inf) {
      workLower[i] = 0, workUpper[i] = 1;         // LOWER
    } else {
      workLower[i] = 0, workUpper[i] = 0;         // BOXED or FIXED
    }
    workRange[i] = workUpper[i] - workLower[i];
  }
}